

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::pushItem(TestResultParser *this,Item *item)

{
  Item *local_18;
  Item *item_local;
  TestResultParser *this_local;
  
  local_18 = item;
  item_local = (Item *)this;
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::push_back
            (&this->m_itemStack,&local_18);
  updateCurrentItemList(this);
  return;
}

Assistant:

void TestResultParser::pushItem (ri::Item* item)
{
	m_itemStack.push_back(item);
	updateCurrentItemList();
}